

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_pipeline_layout
               (StateRecorder *recorder,VkPipelineLayoutCreateInfo *layout,Hash *out_hash)

{
  VkPushConstantRange *pVVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Hash hash;
  ulong local_38;
  
  uVar4 = (ulong)layout->setLayoutCount ^ 0xaf63bd4c8601b7df;
  bVar6 = (ulong)layout->setLayoutCount == 0;
  if (!bVar6) {
    uVar5 = 0;
    do {
      if (layout->pSetLayouts[uVar5] == (VkDescriptorSetLayout)0x0) {
        uVar4 = uVar4 * 0x100000001b3;
      }
      else {
        bVar2 = StateRecorder::get_hash_for_descriptor_set_layout
                          (recorder,layout->pSetLayouts[uVar5],&local_38);
        if (!bVar2) {
          return bVar6;
        }
        uVar4 = (local_38 & 0xffffffff ^ uVar4 * 0x100000001b3) * 0x100000001b3 ^ local_38 >> 0x20;
      }
      uVar5 = uVar5 + 1;
      bVar2 = uVar5 < layout->setLayoutCount;
      bVar6 = !bVar2;
    } while (bVar2);
  }
  uVar5 = (ulong)layout->pushConstantRangeCount;
  uVar4 = uVar4 * 0x100000001b3 ^ uVar5;
  if (uVar5 != 0) {
    pVVar1 = layout->pPushConstantRanges;
    lVar3 = 0;
    do {
      uVar4 = ((uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->stageFlags + lVar3)) *
               0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->size + lVar3)) * 0x100000001b3 ^
              (ulong)*(uint *)((long)&pVVar1->offset + lVar3);
      lVar3 = lVar3 + 0xc;
    } while (uVar5 * 0xc != lVar3);
  }
  *out_hash = uVar4 * 0x100000001b3 ^ (ulong)layout->flags;
  return bVar6;
}

Assistant:

bool compute_hash_pipeline_layout(const StateRecorder &recorder, const VkPipelineLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.setLayoutCount);
	for (uint32_t i = 0; i < layout.setLayoutCount; i++)
	{
		if (layout.pSetLayouts[i])
		{
			Hash hash;
			if (!recorder.get_hash_for_descriptor_set_layout(layout.pSetLayouts[i], &hash))
				return false;
			h.u64(hash);
		}
		else
			h.u32(0);
	}

	h.u32(layout.pushConstantRangeCount);
	for (uint32_t i = 0; i < layout.pushConstantRangeCount; i++)
	{
		auto &push = layout.pPushConstantRanges[i];
		h.u32(push.stageFlags);
		h.u32(push.size);
		h.u32(push.offset);
	}

	h.u32(layout.flags);

	*out_hash = h.get();
	return true;
}